

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::ActivationLinear::SharedCtor(ActivationLinear *this)

{
  this->alpha_ = 0.0;
  this->beta_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ActivationLinear::SharedCtor() {
  ::memset(&alpha_, 0, reinterpret_cast<char*>(&beta_) -
    reinterpret_cast<char*>(&alpha_) + sizeof(beta_));
  _cached_size_ = 0;
}